

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_IFC(Context *ctx)

{
  char *pcVar1;
  char local_28 [8];
  char op [16];
  Context *ctx_local;
  
  pcVar1 = get_D3D_comparison_string(ctx);
  snprintf(local_28,0x10,"if%s",pcVar1);
  emit_D3D_opcode_ss(ctx,local_28);
  return;
}

Assistant:

static void emit_D3D_IFC(Context *ctx)
{
    char op[16];
    snprintf(op, sizeof (op), "if%s", get_D3D_comparison_string(ctx));
    emit_D3D_opcode_ss(ctx, op);
}